

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

index_t __thiscall xLearn::InmemReader::Samples(InmemReader *this,DMatrix **matrix)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  DMatrix *pDVar12;
  
  uVar7 = this->num_samples_;
  if ((ulong)uVar7 != 0) {
    uVar1 = (this->data_buf_).row_length;
    uVar2 = this->pos_;
    uVar9 = 0;
    uVar10 = (ulong)(uVar1 - uVar2);
    if (uVar1 < uVar2) {
      uVar10 = uVar9;
    }
    do {
      if (uVar10 == uVar9) {
        if (uVar1 <= uVar2) {
          if ((this->super_Reader).shuffle_ == true) {
            srand((this->super_Reader).seed_ + 1);
            puVar4 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar5 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((puVar4 != puVar5) && (puVar4 + 1 != puVar5)) {
              lVar11 = 4;
              do {
                iVar6 = rand();
                lVar8 = (long)iVar6 % ((lVar11 >> 2) + 1);
                if (lVar11 != lVar8 * 4) {
                  uVar7 = *(uint *)((long)puVar4 + lVar11);
                  *(uint *)((long)puVar4 + lVar11) = puVar4[lVar8];
                  puVar4[lVar8] = uVar7;
                }
                lVar8 = lVar11 + 4;
                lVar11 = lVar11 + 4;
                uVar7 = 0;
                pDVar12 = (DMatrix *)0x0;
              } while ((pointer)((long)puVar4 + lVar8) != puVar5);
              goto LAB_00125ac5;
            }
          }
          pDVar12 = (DMatrix *)0x0;
          uVar7 = 0;
          goto LAB_00125ac5;
        }
        break;
      }
      (this->super_Reader).data_samples_.row.
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar9] =
           (this->data_buf_).row.
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2 + uVar9]];
      uVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[uVar2 + uVar9];
      (this->super_Reader).data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl
      .super__Vector_impl_data._M_start[uVar9] =
           (this->data_buf_).Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
      iVar6 = (int)uVar9;
      (this->super_Reader).data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar9] =
           (this->data_buf_).norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
      uVar9 = uVar9 + 1;
      this->pos_ = uVar2 + 1 + iVar6;
    } while (uVar7 != uVar9);
  }
  pDVar12 = &(this->super_Reader).data_samples_;
LAB_00125ac5:
  *matrix = pDVar12;
  return uVar7;
}

Assistant:

index_t InmemReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= data_buf_.row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = data_buf_.row[order_[pos_]];
    data_samples_.Y[i] = data_buf_.Y[order_[pos_]];
    data_samples_.norm[i] = data_buf_.norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}